

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathStringLengthFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  xmlNode *cur;
  int iVar1;
  long lVar2;
  xmlChar *utf;
  xmlXPathObjectPtr pxVar3;
  xmlXPathObjectPtr value;
  
  if (nargs == 0) {
    if ((ctxt != (xmlXPathParserContextPtr)0x0) && (ctxt->context != (xmlXPathContextPtr)0x0)) {
      cur = ctxt->context->node;
      if (cur != (xmlNode *)0x0) {
        utf = xmlNodeGetContent(cur);
        if (utf == (xmlChar *)0x0) {
          xmlXPathPErrMemory(ctxt);
        }
        iVar1 = xmlUTF8Strlen(utf);
        pxVar3 = xmlXPathCacheNewFloat(ctxt,(double)iVar1);
        xmlXPathValuePush(ctxt,pxVar3);
        (*xmlFree)(utf);
        return;
      }
      pxVar3 = xmlXPathCacheNewFloat(ctxt,0.0);
      xmlXPathValuePush(ctxt,pxVar3);
      return;
    }
  }
  else if (ctxt != (xmlXPathParserContextPtr)0x0) {
    if (nargs == 1) {
      if (ctxt->valueNr < 1) {
        iVar1 = 0x17;
      }
      else {
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
          xmlXPathStringFunction(ctxt,1);
        }
        if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type == XPATH_STRING)) {
          iVar1 = ctxt->valueNr;
          lVar2 = (long)iVar1;
          if (lVar2 < 1) {
            pxVar3 = (xmlXPathObjectPtr)0x0;
          }
          else {
            ctxt->valueNr = iVar1 + -1;
            if (iVar1 == 1) {
              pxVar3 = (xmlXPathObjectPtr)0x0;
            }
            else {
              pxVar3 = ctxt->valueTab[lVar2 + -2];
            }
            ctxt->value = pxVar3;
            pxVar3 = ctxt->valueTab[lVar2 + -1];
            ctxt->valueTab[lVar2 + -1] = (xmlXPathObjectPtr)0x0;
          }
          iVar1 = xmlUTF8Strlen(pxVar3->stringval);
          value = xmlXPathCacheNewFloat(ctxt,(double)iVar1);
          xmlXPathValuePush(ctxt,value);
          xmlXPathReleaseObject(ctxt->context,pxVar3);
          return;
        }
        iVar1 = 0xb;
      }
    }
    else {
      iVar1 = 0xc;
    }
    xmlXPathErr(ctxt,iVar1);
    return;
  }
  return;
}

Assistant:

void
xmlXPathStringLengthFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur;

    if (nargs == 0) {
        if ((ctxt == NULL) || (ctxt->context == NULL))
	    return;
	if (ctxt->context->node == NULL) {
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt, 0));
	} else {
	    xmlChar *content;

	    content = xmlXPathCastNodeToString(ctxt->context->node);
            if (content == NULL)
                xmlXPathPErrMemory(ctxt);
	    xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt,
		xmlUTF8Strlen(content)));
	    xmlFree(content);
	}
	return;
    }
    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    cur = xmlXPathValuePop(ctxt);
    xmlXPathValuePush(ctxt, xmlXPathCacheNewFloat(ctxt,
	xmlUTF8Strlen(cur->stringval)));
    xmlXPathReleaseObject(ctxt->context, cur);
}